

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O1

int __thiscall chrono::ChLinkLock::GetDOC_d(ChLinkLock *this)

{
  ChLinkLimit *pCVar1;
  int iVar2;
  
  iVar2 = this->ndoc_d;
  pCVar1 = (this->limit_X)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar1 != (ChLinkLimit *)0x0) && (pCVar1->m_active == true)) {
    iVar2 = iVar2 + (uint)*(bool *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x2c) +
            (uint)*(bool *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x2c);
  }
  pCVar1 = (this->limit_Y)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar1 != (ChLinkLimit *)0x0) && (pCVar1->m_active == true)) {
    iVar2 = iVar2 + (uint)*(bool *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x2c) +
            (uint)*(bool *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x2c);
  }
  pCVar1 = (this->limit_Z)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar1 != (ChLinkLimit *)0x0) && (pCVar1->m_active == true)) {
    iVar2 = iVar2 + (uint)*(bool *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x2c) +
            (uint)*(bool *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x2c);
  }
  pCVar1 = (this->limit_Rx)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar1 != (ChLinkLimit *)0x0) && (pCVar1->m_active == true)) {
    iVar2 = iVar2 + (uint)*(bool *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x2c) +
            (uint)*(bool *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x2c);
  }
  pCVar1 = (this->limit_Ry)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar1 != (ChLinkLimit *)0x0) && (pCVar1->m_active == true)) {
    iVar2 = iVar2 + (uint)*(bool *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x2c) +
            (uint)*(bool *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x2c);
  }
  pCVar1 = (this->limit_Rz)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar1 != (ChLinkLimit *)0x0) && (pCVar1->m_active == true)) {
    iVar2 = iVar2 + (uint)*(bool *)((long)&(pCVar1->constr_lower).super_ChConstraintTwo + 0x2c) +
            (uint)*(bool *)((long)&(pCVar1->constr_upper).super_ChConstraintTwo + 0x2c);
  }
  return iVar2;
}

Assistant:

int ChLinkLock::GetDOC_d() {
    int mdocd = ndoc_d;

    if (limit_X && limit_X->IsActive()) {
        if (limit_X->constr_lower.IsActive())
            ++mdocd;
        if (limit_X->constr_upper.IsActive())
            ++mdocd;
    }
    if (limit_Y && limit_Y->IsActive()) {
        if (limit_Y->constr_lower.IsActive())
            ++mdocd;
        if (limit_Y->constr_upper.IsActive())
            ++mdocd;
    }
    if (limit_Z && limit_Z->IsActive()) {
        if (limit_Z->constr_lower.IsActive())
            ++mdocd;
        if (limit_Z->constr_upper.IsActive())
            ++mdocd;
    }
    if (limit_Rx && limit_Rx->IsActive()) {
        if (limit_Rx->constr_lower.IsActive())
            ++mdocd;
        if (limit_Rx->constr_upper.IsActive())
            ++mdocd;
    }
    if (limit_Ry && limit_Ry->IsActive()) {
        if (limit_Ry->constr_lower.IsActive())
            ++mdocd;
        if (limit_Ry->constr_upper.IsActive())
            ++mdocd;
    }
    if (limit_Rz && limit_Rz->IsActive()) {
        if (limit_Rz->constr_lower.IsActive())
            ++mdocd;
        if (limit_Rz->constr_upper.IsActive())
            ++mdocd;
    }

    return mdocd;
}